

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::next_after_siblings(depth_first_traverser *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->stack_).
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != pcVar1) {
    pcVar1[-1].cur._M_current = pcVar1[-1].end._M_current + -1;
    next_sibling(this);
  }
  return this;
}

Assistant:

depth_first_traverser&
        next_after_siblings() {
            if(stack_.empty()) return *this;
            stack_.back().cur = stack_.back().end-1;
            next_sibling();
            return *this;
        }